

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

Result * __thiscall
diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::resolve
          (Result *__return_storage_ptr__,ShaderSubgroupSupportHelper *this)

{
  char *this_00;
  bool bVar1;
  Candidate *pCVar2;
  Candidate *pCVar3;
  reference puVar4;
  _Node_iterator_base<unsigned_int,_false> _Stack_150;
  uint32_t c;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3_1;
  Feature local_f4;
  Feature *pFStack_f0;
  Feature d;
  Feature *__end3;
  Feature *__begin3;
  FeatureVector *__range3;
  FeatureVector deps;
  undefined1 local_90 [8];
  CandidateVector candidates;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  unique_candidates;
  Feature feature;
  uint32_t i;
  ShaderSubgroupSupportHelper *this_local;
  
  Result::Result(__return_storage_ptr__);
  for (unique_candidates._M_h._M_single_bucket._4_4_ = SubgroupMask;
      unique_candidates._M_h._M_single_bucket._4_4_ < FeatureCount;
      unique_candidates._M_h._M_single_bucket._4_4_ =
           unique_candidates._M_h._M_single_bucket._4_4_ + SubgroupSize) {
    if ((this->feature_mask & 1 << ((byte)unique_candidates._M_h._M_single_bucket._4_4_ & 0x1f)) !=
        0) {
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)(candidates.stack_storage.aligned_char + 0x20));
      get_candidates_for_feature
                ((CandidateVector *)local_90,unique_candidates._M_h._M_single_bucket._4_4_);
      pCVar2 = VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
               ::begin((VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                        *)local_90);
      pCVar3 = VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
               ::end((VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                      *)local_90);
      ::std::
      unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
      ::insert<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate*>
                ((unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                  *)(candidates.stack_storage.aligned_char + 0x20),pCVar2,pCVar3);
      get_feature_dependencies
                ((FeatureVector *)&__range3,unique_candidates._M_h._M_single_bucket._4_4_);
      __begin3 = (Feature *)&__range3;
      __end3 = VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
               ::begin((VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
                        *)__begin3);
      pFStack_f0 = VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
                   ::end((VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
                          *)__begin3);
      for (; __end3 != pFStack_f0; __end3 = __end3 + 1) {
        local_f4 = *__end3;
        get_candidates_for_feature((CandidateVector *)&__range3_1,local_f4);
        SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
        ::operator=((SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
                     *)local_90,
                    (SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
                     *)&__range3_1);
        SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
        ::~SmallVector((SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
                        *)&__range3_1);
        bVar1 = VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                ::empty((VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                         *)local_90);
        if (!bVar1) {
          pCVar2 = VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                   ::begin((VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                            *)local_90);
          pCVar3 = VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                   ::end((VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                          *)local_90);
          ::std::
          unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
          ::insert<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate*>
                    ((unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                      *)(candidates.stack_storage.aligned_char + 0x20),pCVar2,pCVar3);
        }
      }
      this_00 = candidates.stack_storage.aligned_char + 0x20;
      __end3_1 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)this_00);
      _Stack_150._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)this_00);
      while( true ) {
        bVar1 = ::std::__detail::operator!=
                          (&__end3_1.super__Node_iterator_base<unsigned_int,_false>,
                           &stack0xfffffffffffffeb0);
        if (!bVar1) break;
        puVar4 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end3_1);
        __return_storage_ptr__->weights[*puVar4] = __return_storage_ptr__->weights[*puVar4] + 1;
        ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end3_1);
      }
      SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::
      ~SmallVector((SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>
                    *)&__range3);
      SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
      ::~SmallVector((SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
                      *)local_90);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)(candidates.stack_storage.aligned_char + 0x20));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::Result CompilerGLSL::ShaderSubgroupSupportHelper::resolve() const
{
	Result res;

	for (uint32_t i = 0u; i < FeatureCount; ++i)
	{
		if (feature_mask & (1u << i))
		{
			auto feature = static_cast<Feature>(i);
			std::unordered_set<uint32_t> unique_candidates;

			auto candidates = get_candidates_for_feature(feature);
			unique_candidates.insert(candidates.begin(), candidates.end());

			auto deps = get_feature_dependencies(feature);
			for (Feature d : deps)
			{
				candidates = get_candidates_for_feature(d);
				if (!candidates.empty())
					unique_candidates.insert(candidates.begin(), candidates.end());
			}

			for (uint32_t c : unique_candidates)
				++res.weights[static_cast<Candidate>(c)];
		}
	}

	return res;
}